

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin.cpp
# Opt level: O3

Plugin * csm::Plugin::findPlugin(string *pluginName,WarningList *warnings)

{
  pointer __n;
  long *plVar1;
  list<csm::Warning,_std::allocator<csm::Warning>_> *__position;
  undefined8 uVar2;
  int iVar3;
  pthread_mutex_t *__mutex;
  long *plVar4;
  Plugin *pPVar5;
  bool bVar6;
  WarningType local_c4;
  list<csm::Warning,_std::allocator<csm::Warning>_> *local_c0;
  string local_b8;
  string local_98;
  Warning local_78;
  
  __mutex = (pthread_mutex_t *)impl();
  pthread_mutex_lock(__mutex);
  if (theList_abi_cxx11_ == (long *)0x0) {
    theList_abi_cxx11_ = (long *)operator_new(0x18);
    theList_abi_cxx11_[1] = (long)theList_abi_cxx11_;
    *theList_abi_cxx11_ = (long)theList_abi_cxx11_;
    theList_abi_cxx11_[2] = 0;
  }
  plVar1 = theList_abi_cxx11_;
  plVar4 = theList_abi_cxx11_;
  local_c0 = warnings;
  do {
    __position = local_c0;
    plVar4 = (long *)*plVar4;
    if (plVar4 == plVar1) {
      if (local_c0 != (list<csm::Warning,_std::allocator<csm::Warning>_> *)0x0) {
        local_c4 = DATA_NOT_AVAILABLE;
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,"No matching plugin found","");
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Plugin::findPlugin","")
        ;
        Warning::Warning(&local_78,&local_c4,&local_98,&local_b8);
        std::__cxx11::list<csm::Warning,_std::allocator<csm::Warning>_>::_M_insert<csm::Warning>
                  (__position,(iterator)__position,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78.theFunction._M_dataplus._M_p != &local_78.theFunction.field_2) {
          operator_delete(local_78.theFunction._M_dataplus._M_p,
                          local_78.theFunction.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78.theMessage._M_dataplus._M_p != &local_78.theMessage.field_2) {
          operator_delete(local_78.theMessage._M_dataplus._M_p,
                          local_78.theMessage.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
      }
      pPVar5 = (Plugin *)0x0;
      goto LAB_0011b3a6;
    }
    (**(code **)(*(long *)plVar4[2] + 0x10))(&local_78);
    uVar2 = local_78._0_8_;
    __n = (pointer)pluginName->_M_string_length;
    if (__n == local_78.theMessage._M_dataplus._M_p) {
      if (__n == (pointer)0x0) {
        bVar6 = true;
      }
      else {
        iVar3 = bcmp((pluginName->_M_dataplus)._M_p,(void *)local_78._0_8_,(size_t)__n);
        bVar6 = iVar3 == 0;
      }
    }
    else {
      bVar6 = false;
    }
    if ((void *)uVar2 != (void *)((long)&local_78 + 0x10U)) {
      operator_delete((void *)uVar2,local_78.theMessage._M_string_length + 1);
    }
  } while (!bVar6);
  pPVar5 = (Plugin *)plVar4[2];
LAB_0011b3a6:
  pthread_mutex_unlock(__mutex);
  return pPVar5;
}

Assistant:

const Plugin* Plugin::findPlugin(const std:: string& pluginName,
                                 WarningList* warnings)
{
   Impl::Locker locker(impl());

   const PluginList& plugins = getList();

   for (PluginList::const_iterator i = plugins.begin();
        i != plugins.end(); ++i)
   {
      if (pluginName == (*i)->getPluginName())
      {
         return *i;
      }
   }

   // plugin not found
   if (warnings)
   {
      warnings->push_back(Warning(Warning::DATA_NOT_AVAILABLE,
                                  "No matching plugin found",
                                  "Plugin::findPlugin"));
   }

   return NULL;
}